

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O1

double google::DoubleFromEnv(char *v,double dflt)

{
  bool bVar1;
  char *__s;
  void *valbuf;
  FlagValue ifv;
  string valstr;
  double local_50;
  FlagValue local_48;
  char *local_38;
  undefined8 local_30;
  char local_28 [16];
  
  local_30 = 0;
  local_28[0] = '\0';
  local_38 = local_28;
  __s = getenv(v);
  local_50 = dflt;
  if (__s != (char *)0x0) {
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_38,0,(char *)0x0,(ulong)__s);
    valbuf = operator_new(8);
    anon_unknown_1::FlagValue::FlagValue(&local_48,valbuf,"double",true);
    bVar1 = anon_unknown_1::FlagValue::ParseFrom(&local_48,local_38);
    if (!bVar1) {
      anon_unknown_1::ReportError
                (DIE,"ERROR: error parsing env variable \'%s\' with value \'%s\'\n",v,local_38);
    }
    local_50 = *local_48.value_buffer_;
    anon_unknown_1::FlagValue::~FlagValue(&local_48);
  }
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return local_50;
}

Assistant:

double DoubleFromEnv(const char *v, double dflt) {
  return GetFromEnv(v, "double", dflt);
}